

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

menu_data * __thiscall
dlib::array<dlib::menu_bar::menu_data,_dlib::memory_manager_stateless_kernel_1<char>_>::element
          (array<dlib::menu_bar::menu_data,_dlib::memory_manager_stateless_kernel_1<char>_> *this)

{
  array<dlib::menu_bar::menu_data,_dlib::memory_manager_stateless_kernel_1<char>_> *this_local;
  
  return this->pos;
}

Assistant:

const T& array<T,mem_manager>::
    element (
    ) const
    {
        // make sure requires clause is not broken
        DLIB_ASSERT(this->current_element_valid(),
            "\tconst T& array::element()"
            << "\n\tThe current element must be valid if you are to access it."
            << "\n\tthis: " << this
            );

        return *pos;
    }